

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O2

bool __thiscall Js::SharedContents::IsValidAgent(SharedContents *this,DWORD_PTR agent)

{
  bool bVar1;
  DWORD_PTR local_20;
  DWORD_PTR agent_local;
  AutoCriticalSection autoCS;
  
  agent_local = (DWORD_PTR)&this->csAgent;
  local_20 = agent;
  CCLock::Enter((CCLock *)agent_local);
  if (this->allowedAgents == (SharableAgents *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = JsUtil::ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>::Contains
                      (&this->allowedAgents->
                        super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>,
                       &local_20);
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&agent_local);
  return bVar1;
}

Assistant:

bool SharedContents::IsValidAgent(DWORD_PTR agent)
    {
        AutoCriticalSection autoCS(&csAgent);
        return allowedAgents != nullptr && allowedAgents->Contains(agent);
    }